

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O0

void test_barcode<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
               (void)

{
  Column_settings **this;
  pointer *__x;
  undefined8 uVar1;
  bool bVar2;
  Barcode *this_00;
  reference witness;
  pointer __args;
  pointer pPVar3;
  pointer pPVar4;
  reference pPVar5;
  int *__args_00;
  uint *__args_1;
  uint *__args_2;
  type_conflict1 *__args_1_00;
  type_conflict1 *__args_2_00;
  type_conflict *__args_01;
  lazy_ostream *plVar6;
  reference ptVar7;
  __tuple_element_t<0UL,_tuple<int,_int,_int>_> *p_Var8;
  __tuple_element_t<1UL,_tuple<int,_int,_int>_> *p_Var9;
  __tuple_element_t<2UL,_tuple<int,_int,_int>_> *p_Var10;
  pair<std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>,_bool> pVar11;
  basic_cstring<const_char> local_a20;
  basic_cstring<const_char> local_a10;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_a00;
  assertion_result local_9e0;
  basic_cstring<const_char> local_9c8;
  basic_cstring<const_char> local_9b8;
  basic_cstring<const_char> local_9a8;
  basic_cstring<const_char> local_998;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_988;
  assertion_result local_968;
  basic_cstring<const_char> local_950;
  basic_cstring<const_char> local_940;
  basic_cstring<const_char> local_930;
  basic_cstring<const_char> local_920;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_910;
  _Self local_8f0;
  assertion_result local_8e8;
  basic_cstring<const_char> local_8d0;
  basic_cstring<const_char> local_8c0;
  undefined4 local_8ac;
  basic_cstring<const_char> local_8a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_898;
  basic_cstring<const_char> local_870;
  basic_cstring<const_char> local_860;
  undefined4 local_84c;
  basic_cstring<const_char> local_848;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_838;
  basic_cstring<const_char> local_810;
  basic_cstring<const_char> local_800;
  undefined4 local_7ec;
  basic_cstring<const_char> local_7e8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_7d8;
  basic_cstring<const_char> local_7b0;
  basic_cstring<const_char> local_7a0;
  undefined4 local_78c;
  basic_cstring<const_char> local_788;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_778;
  basic_cstring<const_char> local_750;
  basic_cstring<const_char> local_740;
  undefined4 local_72c;
  basic_cstring<const_char> local_728;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_718;
  basic_cstring<const_char> local_6f0;
  basic_cstring<const_char> local_6e0;
  undefined4 local_6cc;
  basic_cstring<const_char> local_6c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_6b8;
  basic_cstring<const_char> local_690;
  basic_cstring<const_char> local_680;
  undefined4 local_66c;
  basic_cstring<const_char> local_668;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_658;
  basic_cstring<const_char> local_630;
  basic_cstring<const_char> local_620;
  undefined4 local_60c;
  basic_cstring<const_char> local_608;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_5f8;
  basic_cstring<const_char> local_5d0;
  basic_cstring<const_char> local_5c0;
  undefined4 local_5ac;
  basic_cstring<const_char> local_5a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_598;
  basic_cstring<const_char> local_570;
  basic_cstring<const_char> local_560;
  undefined4 local_54c;
  basic_cstring<const_char> local_548;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_538;
  basic_cstring<const_char> local_510;
  basic_cstring<const_char> local_500;
  undefined4 local_4ec;
  basic_cstring<const_char> local_4e8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_4d8;
  basic_cstring<const_char> local_4b0;
  basic_cstring<const_char> local_4a0;
  undefined4 local_48c;
  basic_cstring<const_char> local_488;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_478;
  basic_cstring<const_char> local_450;
  basic_cstring<const_char> local_440;
  undefined4 local_42c;
  basic_cstring<const_char> local_428;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_418;
  basic_cstring<const_char> local_3f0;
  basic_cstring<const_char> local_3e0;
  undefined4 local_3cc;
  basic_cstring<const_char> local_3c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_3b8;
  basic_cstring<const_char> local_390;
  basic_cstring<const_char> local_380;
  undefined4 local_36c;
  basic_cstring<const_char> local_368;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_358;
  basic_cstring<const_char> local_330;
  basic_cstring<const_char> local_320;
  _Rb_tree_const_iterator<std::tuple<int,_int,_int>_> local_310;
  iterator it;
  type *z;
  type *y;
  type *x;
  uint local_2d8;
  _Base_ptr local_2d0;
  undefined1 local_2c8;
  _Base_ptr local_2c0;
  undefined1 local_2b8;
  _Self local_2b0;
  _Self local_2a8;
  const_iterator it_1;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars3;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars2;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *r;
  iterator __end0;
  iterator __begin0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range2;
  undefined1 local_1b8 [4];
  uint i;
  undefined1 local_1a0 [8];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  rows;
  Barcode *barcode;
  undefined1 local_158 [8];
  Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>
  m;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  
  build_longer_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>>
            ();
  Gudhi::persistence_matrix::
  Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>
  ::Matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>
              *)local_158,
             (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&m.matrix_.colSettings_,5);
  this_00 = Gudhi::persistence_matrix::
            Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>
            ::get_current_barcode_abi_cxx11_
                      ((Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>
                        *)local_158);
  build_longer_chain_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>>
            ();
  this = &m.matrix_.colSettings_;
  __x = &rows.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::operator=((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)this,(vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       *)__x);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)__x);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)this,(Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>
                      *)local_158);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)local_1a0);
  build_longer_chain_row_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>>
            ();
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::operator=((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_1a0,
              (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_1b8);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_1b8);
  __range2._4_4_ = 0;
  __end0 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::begin((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)local_1a0);
  r = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::end((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_1a0);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                     *)&r), bVar2) {
    witness = __gnu_cxx::
              __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::operator*(&__end0);
    get_ordered_row<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>
              ((column_content<typename_Matrix<Chain_rep_options_with_row_access<true,_(Column_types)7,_true,_false,_false,_true,_false,_true>_>::Column>
                *)&bars1._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>
                *)local_158,__range2._4_4_);
    test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>>
              (witness,(column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>_>
                        *)&bars1._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               &bars1._M_t._M_impl.super__Rb_tree_header._M_node_count);
    __gnu_cxx::
    __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::operator++(&__end0);
    __range2._4_4_ = __range2._4_4_ + 1;
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_1a0);
  std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::set
            ((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::set
            ((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&bars3._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::set
            ((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&it_1);
  local_2a8._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
       ::begin(this_00);
  while( true ) {
    local_2b0._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
         ::end(this_00);
    bVar2 = std::operator!=(&local_2a8,&local_2b0);
    if (!bVar2) break;
    __args = std::
             _List_const_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>
             ::operator->(&local_2a8);
    pPVar3 = std::
             _List_const_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>
             ::operator->(&local_2a8);
    pPVar4 = std::
             _List_const_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>
             ::operator->(&local_2a8);
    pVar11 = std::
             set<std::tuple<int,int,int>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
             ::emplace<int_const&,unsigned_int_const&,unsigned_int_const&>
                       ((set<std::tuple<int,int,int>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                         *)&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count,&__args->dim,
                        &pPVar3->birth,&pPVar4->death);
    local_2c0 = (_Base_ptr)pVar11.first._M_node;
    local_2b8 = pVar11.second;
    pPVar5 = std::
             _List_const_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>
             ::operator*(&local_2a8);
    __args_00 = std::get<2ul,int,unsigned_int>(pPVar5);
    pPVar5 = std::
             _List_const_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>
             ::operator*(&local_2a8);
    __args_1 = std::get<0ul,int,unsigned_int>(pPVar5);
    pPVar5 = std::
             _List_const_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>
             ::operator*(&local_2a8);
    __args_2 = std::get<1ul,int,unsigned_int>(pPVar5);
    pVar11 = std::
             set<std::tuple<int,int,int>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
             ::emplace<int_const&,unsigned_int_const&,unsigned_int_const&>
                       ((set<std::tuple<int,int,int>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                         *)&bars3._M_t._M_impl.super__Rb_tree_header._M_node_count,__args_00,
                        __args_1,__args_2);
    local_2d0 = (_Base_ptr)pVar11.first._M_node;
    local_2c8 = pVar11.second;
    pPVar5 = std::
             _List_const_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>
             ::operator*(&local_2a8);
    local_2d8 = pPVar5->death;
    x = *(type **)pPVar5;
    __args_1_00 = Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>::get<0ul>
                            ((Persistence_interval<int,unsigned_int> *)&x);
    __args_2_00 = Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>::get<1ul>
                            ((Persistence_interval<int,unsigned_int> *)&x);
    __args_01 = Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>::get<2ul>
                          ((Persistence_interval<int,unsigned_int> *)&x);
    pVar11 = std::
             set<std::tuple<int,int,int>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
             ::emplace<int&,unsigned_int&,unsigned_int&>
                       ((set<std::tuple<int,int,int>,test_barcode<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,false,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                         *)&it_1,__args_01,__args_1_00,__args_2_00);
    it._M_node = (_Base_ptr)pVar11.first._M_node;
    std::_List_const_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>::
    operator++(&local_2a8);
  }
  local_310._M_node =
       (_Base_ptr)
       std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::
       begin((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_320,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_330);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_320,0x574,&local_330);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_358,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_368,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_310);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_36c = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_358,&local_368,0x574,1,2,p_Var8,"std::get<0>(*it)",&local_36c,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_358);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_380,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_390);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_380,0x575,&local_390);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_3b8,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3c8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_310);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_3cc = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_3b8,&local_3c8,0x575,1,2,p_Var9,"std::get<1>(*it)",&local_3cc,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_3b8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3e0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3e0,0x577,&local_3f0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_418,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_428,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_310);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_42c = 0xffffffff;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_418,&local_428,0x577,1,2,p_Var10,"std::get<2>(*it)",&local_42c,"-1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_418);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_310);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_440,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_450);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_440,0x579,&local_450);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_478,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_488,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_310);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_48c = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_478,&local_488,0x579,1,2,p_Var8,"std::get<0>(*it)",&local_48c,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_478);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_4b0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_4a0,0x57a,&local_4b0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_4d8,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_310);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_4ec = 1;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_4d8,&local_4e8,0x57a,1,2,p_Var9,"std::get<1>(*it)",&local_4ec,"1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_4d8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_500,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_510);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_500,0x57b,&local_510);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_538,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_548,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_310);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_54c = 3;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_538,&local_548,0x57b,1,2,p_Var10,"std::get<2>(*it)",&local_54c,"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_538);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_310);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_560,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_570);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_560,0x57d,&local_570);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_598,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5a8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_310);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_5ac = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_598,&local_5a8,0x57d,1,2,p_Var8,"std::get<0>(*it)",&local_5ac,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_598);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5c0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_5d0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_5c0,0x57e,&local_5d0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_5f8,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_608,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_310);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_60c = 2;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_5f8,&local_608,0x57e,1,2,p_Var9,"std::get<1>(*it)",&local_60c,"2");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_5f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_620,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_630);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_620,0x57f,&local_630);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_658,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_668,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_310);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_66c = 4;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_658,&local_668,0x57f,1,2,p_Var10,"std::get<2>(*it)",&local_66c,"4");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_658);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_310);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_680,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_690);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_680,0x581,&local_690);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_6b8,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6c8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_310);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_6cc = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_6b8,&local_6c8,0x581,1,2,p_Var8,"std::get<0>(*it)",&local_6cc,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_6b8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6e0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_6f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_6e0,0x582,&local_6f0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_718,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_728,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_310);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_72c = 7;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_718,&local_728,0x582,1,2,p_Var9,"std::get<1>(*it)",&local_72c,"7");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_718);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_740,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_750);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_740,0x583,&local_750);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_778,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_788,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_310);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_78c = 8;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_778,&local_788,0x583,1,2,p_Var10,"std::get<2>(*it)",&local_78c,"8");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_778);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_310);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_7b0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_7a0,0x585,&local_7b0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_7d8,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_7e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_310);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_7ec = 1;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_7d8,&local_7e8,0x585,1,2,p_Var8,"std::get<0>(*it)",&local_7ec,"1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_7d8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_800,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_810);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_800,0x586,&local_810);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_838,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_848,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_310);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_84c = 5;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_838,&local_848,0x586,1,2,p_Var9,"std::get<1>(*it)",&local_84c,"5");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_838);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_860,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_870);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_860,0x587,&local_870);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_898,plVar6,(char (*) [1])0x2a6234);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8a8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_310);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_8ac = 6;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_898,&local_8a8,0x587,1,2,p_Var10,"std::get<2>(*it)",&local_8ac,"6");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_898);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_310);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8c0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_8d0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_8c0,0x589,&local_8d0);
    local_8f0._M_node =
         (_Base_ptr)
         std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::
         end((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar2 = std::operator==(&local_310,&local_8f0);
    boost::test_tools::assertion_result::assertion_result(&local_8e8,bVar2);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_920,"it == bars1.end()",0x11);
    boost::unit_test::operator<<(&local_910,plVar6,&local_920);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_930,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_8e8,&local_910,&local_930,0x589,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_910);
    boost::test_tools::assertion_result::~assertion_result(&local_8e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_940,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_950);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_940,0x58b,&local_950);
    bVar2 = std::operator==((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
                             *)&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
                             *)&bars3._M_t._M_impl.super__Rb_tree_header._M_node_count);
    boost::test_tools::assertion_result::assertion_result(&local_968,bVar2);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_998,"bars1 == bars2",0xe);
    boost::unit_test::operator<<(&local_988,plVar6,&local_998);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9a8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_968,&local_988,&local_9a8,0x58b,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_988);
    boost::test_tools::assertion_result::~assertion_result(&local_968);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9b8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_9c8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_9b8,0x58c,&local_9c8);
    bVar2 = std::operator==((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
                             *)&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
                             *)&it_1);
    boost::test_tools::assertion_result::assertion_result(&local_9e0,bVar2);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a10,"bars1 == bars3",0xe);
    boost::unit_test::operator<<(&local_a00,plVar6,&local_a10);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a20,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_9e0,&local_a00,&local_a20,0x58c,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_a00);
    boost::test_tools::assertion_result::~assertion_result(&local_9e0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::~set
            ((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&it_1);
  std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::~set
            ((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&bars3._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::~set
            ((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count);
  Gudhi::persistence_matrix::
  Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>
  ::~Matrix((Matrix<Chain_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>
             *)local_158);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&m.matrix_.colSettings_);
  return;
}

Assistant:

void test_barcode() {
  struct BarComp {
    bool operator()(const std::tuple<int, int, int>& c1, const std::tuple<int, int, int>& c2) const {
      if (std::get<0>(c1) != std::get<0>(c2)) return std::get<0>(c1) < std::get<0>(c2);
      if (std::get<1>(c1) != std::get<1>(c2)) return std::get<1>(c1) < std::get<1>(c2);
      return std::get<2>(c1) < std::get<2>(c2);
    }
  };

  auto columns = build_longer_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  const auto& barcode = m.get_current_barcode();

  if constexpr (Matrix::Option_list::is_of_boundary_type) {
    columns[5].clear();
  } else {
    columns = build_longer_chain_matrix<typename Matrix::Column>();
  }
  test_content_equality(columns, m);

  if constexpr (Matrix::Option_list::has_row_access) {
    std::vector<witness_content<typename Matrix::Column> > rows;
    if constexpr (Matrix::Option_list::is_of_boundary_type) {
      rows = build_longer_reduced_row_matrix<typename Matrix::Column>();
    } else {
      rows = build_longer_chain_row_matrix<typename Matrix::Column>();
    }
    unsigned int i = 0;
    for (auto& r : rows) {
      if constexpr (Matrix::Option_list::has_removable_rows)
        if (i == 6) continue;
      test_column_equality<typename Matrix::Column>(r, get_ordered_row(m, i++));
    }
  }

  std::set<std::tuple<int, int, int>, BarComp> bars1;
  std::set<std::tuple<int, int, int>, BarComp> bars2;
  std::set<std::tuple<int, int, int>, BarComp> bars3;
  // bars are not ordered the same for all matrices
  for (auto it = barcode.begin(); it != barcode.end(); ++it) {
    // three access possibilities
    bars1.emplace(it->dim, it->birth, it->death);
    bars2.emplace(std::get<2>(*it), std::get<0>(*it), std::get<1>(*it));
    auto [x, y, z] = *it;
    bars3.emplace(z, x, y);
  }
  auto it = bars1.begin();
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 0);
  // TODO: verify why this -1 works...: it->death should be unsigned int, so double conversion
  BOOST_CHECK_EQUAL(std::get<2>(*it), -1);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 3);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 2);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 4);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 7);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 8);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 5);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 6);
  ++it;
  BOOST_CHECK(it == bars1.end());

  BOOST_CHECK(bars1 == bars2);
  BOOST_CHECK(bars1 == bars3);
}